

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O0

bool Fossilize::decode_varint(uint32_t *words,size_t words_size,uint8_t *buffer,size_t buffer_size)

{
  byte *pbVar1;
  uint *puVar2;
  size_t sVar3;
  uint local_4c;
  uint32_t shift;
  uint32_t *w;
  size_t i;
  size_t offset;
  size_t buffer_size_local;
  uint8_t *buffer_local;
  size_t words_size_local;
  uint32_t *words_local;
  
  i = 0;
  w = (uint32_t *)0x0;
  do {
    if (words_size <= w) {
      return buffer_size == i;
    }
    puVar2 = words + (long)w;
    *puVar2 = 0;
    local_4c = 0;
    do {
      if ((buffer_size <= i) || (0x1f < local_4c)) {
        return false;
      }
      *puVar2 = (buffer[i] & 0x7f) << ((byte)local_4c & 0x1f) | *puVar2;
      local_4c = local_4c + 7;
      sVar3 = i + 1;
      pbVar1 = buffer + i;
      i = sVar3;
    } while ((*pbVar1 & 0x80) != 0);
    w = (uint32_t *)((long)w + 1);
  } while( true );
}

Assistant:

bool decode_varint(uint32_t *words, size_t words_size, const uint8_t *buffer, size_t buffer_size)
{
	size_t offset = 0;
	for (size_t i = 0; i < words_size; i++)
	{
		auto &w = words[i];
		w = 0;

		uint32_t shift = 0;
		do
		{
			if (offset >= buffer_size || shift >= 32u)
				return false;

			w |= (buffer[offset] & 0x7f) << shift;
			shift += 7;
		} while (buffer[offset++] & 0x80);
	}

	return buffer_size == offset;
}